

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O3

timestamp_t
duckdb::TryCastCInternal<duckdb::timestamp_t,duckdb::timestamp_t,duckdb::TryCast>
          (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  timestamp_t result_value;
  timestamp_t local_10;
  
  bVar1 = TryCast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>
                    ((timestamp_t)
                     *(int64_t *)((long)result->deprecated_columns[col].deprecated_data + row * 8),
                     &local_10,false);
  if (!bVar1) {
    local_10 = FetchDefaultValue::Operation<duckdb::timestamp_t>();
  }
  return (timestamp_t)local_10.value;
}

Assistant:

void *UnsafeFetchPtr(duckdb_result *result, idx_t col, idx_t row) {
	D_ASSERT(row < result->deprecated_row_count);
	return (void *)&(((T *)result->deprecated_columns[col].deprecated_data)[row]);
}